

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantiletobin.cpp
# Opt level: O2

void quantiletobin::doit(bool header)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  undefined7 in_register_00000039;
  float quantile;
  char line [4096];
  
  if ((int)CONCAT71(in_register_00000039,header) != 0) {
    fgets(line,0x1000,_stdin);
  }
  uVar3 = 2;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%f",&quantile);
    if (iVar1 != 1) break;
    if ((1.0 < quantile) || (quantile < 0.0)) {
      fprintf(_stderr,"FATAL: Invalid quantile %f on line %d",(double)quantile,(ulong)uVar3);
      fwrite(": quantiles must lie between 0 and 1 - ignoring...\n",0x33,1,_stderr);
    }
    else {
      fwrite(&quantile,4,1,_stdout);
      uVar3 = uVar3 + 1;
    }
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s\n",(ulong)uVar3,line);
  exit(1);
}

Assistant:

void doit(bool header) {

    float quantile;
    char line[4096];
    int lineno = 1;
    if (header) {
      fgets(line, sizeof(line), stdin);   // Skip header line
    }
    lineno++;

    while (fgets(line, sizeof(line), stdin) != 0) {

      if (sscanf(line, "%f", &quantile) != 1) {

	fprintf(stderr, "FATAL: Invalid data in line %d:\n%s\n", lineno, line);
	exit(EXIT_FAILURE);

      } else {
	      
	if (quantile > 1.0 || quantile < 0.0) {
	fprintf(stderr, "FATAL: Invalid quantile %f on line %d", quantile, lineno);
	fprintf(stderr, ": quantiles must lie between 0 and 1 - ignoring...\n");
	continue;
	}

	fwrite(&quantile, sizeof(quantile), 1, stdout);

      }
      lineno++;

    }

  }